

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::(anonymous_namespace)::LoadStoreMachine::Write<tcu::Vector<float,4>>
          (LoadStoreMachine *this,GLenum internalformat,Vector<float,_4> *write_value,
          Vector<float,_4> *expected_value)

{
  bool bVar1;
  GLint GVar2;
  GLenum GVar3;
  GLenum GVar4;
  GLenum GVar5;
  char *pcVar6;
  float *pfVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  Vector<float,_4> *local_5d0;
  string local_470;
  Vector<float,_4> local_450;
  string local_440;
  Vector<float,_4> local_420;
  undefined1 local_410 [8];
  vec4 color;
  Vector<float,_4> local_3e0;
  string local_3d0;
  Vector<float,_4> local_3b0;
  string local_3a0;
  int local_380;
  int local_37c;
  int j;
  int count;
  Vector<float,_4> data_1 [12];
  string local_2b0;
  Vector<float,_4> local_290;
  string local_280;
  Vector<float,_4> local_260;
  string local_250;
  undefined1 local_22c [8];
  Vector<float,_4> data;
  int face;
  int i_1;
  GLuint GStack_20c;
  bool status;
  int i;
  GLuint texture_result;
  GLuint textures [8];
  GLchar *pGStack_1e0;
  GLuint sh_1;
  char *src_1;
  string source_1;
  GLchar *pGStack_1b0;
  GLuint sh;
  char *src;
  string source;
  string local_168;
  char *local_148;
  char *glsl_vs_2;
  string local_120;
  char *local_100;
  char *glsl_vs_1;
  string local_d8;
  char *local_b8;
  char *glsl_tes;
  char *glsl_vs;
  string local_78;
  GLuint local_54;
  GLuint local_50;
  GLuint program_load;
  GLuint program_store;
  int kTargets;
  GLenum targets [8];
  Vector<float,_4> *expected_value_local;
  Vector<float,_4> *write_value_local;
  GLenum internalformat_local;
  LoadStoreMachine *this_local;
  
  _program_store = 0xde100000de0;
  targets[0] = 0x806f;
  targets[1] = 0x84f5;
  targets[2] = 0x8513;
  targets[3] = 0x8c18;
  targets[4] = 0x8c1a;
  targets[5] = 0x9009;
  program_load = 8;
  local_50 = 0;
  local_54 = 0;
  targets._24_8_ = expected_value;
  if (*(int *)(this + 0x2c) == 0) {
    GenStoreShader<tcu::Vector<float,4>>
              (&local_78,this,*(int *)(this + 0x2c),internalformat,write_value);
    pcVar6 = (char *)std::__cxx11::string::c_str();
    local_50 = gl4cts::anon_unknown_0::ShaderImageLoadStoreBase::BuildProgram
                         ((ShaderImageLoadStoreBase *)this,pcVar6,(char *)0x0,(char *)0x0,
                          (char *)0x0,(char *)0x0,(bool *)0x0);
    std::__cxx11::string::~string((string *)&local_78);
    GenLoadShader<tcu::Vector<float,4>>
              ((string *)&glsl_vs,this,*(int *)(this + 0x2c),internalformat,
               (Vector<float,_4> *)targets._24_8_);
    pcVar6 = (char *)std::__cxx11::string::c_str();
    local_54 = gl4cts::anon_unknown_0::ShaderImageLoadStoreBase::BuildProgram
                         ((ShaderImageLoadStoreBase *)this,pcVar6,(char *)0x0,(char *)0x0,
                          (char *)0x0,(char *)0x0,(bool *)0x0);
    std::__cxx11::string::~string((string *)&glsl_vs);
  }
  else if (*(int *)(this + 0x2c) == 1) {
    glsl_tes = "#version 420 core\nvoid main() {}";
    local_b8 = "#version 420 core\nlayout(quads, point_mode) in;\nvoid main() {}";
    GenStoreShader<tcu::Vector<float,4>>
              (&local_d8,this,*(int *)(this + 0x2c),internalformat,write_value);
    pcVar6 = (char *)std::__cxx11::string::c_str();
    local_50 = gl4cts::anon_unknown_0::ShaderImageLoadStoreBase::BuildProgram
                         ((ShaderImageLoadStoreBase *)this,"#version 420 core\nvoid main() {}",
                          pcVar6,"#version 420 core\nlayout(quads, point_mode) in;\nvoid main() {}",
                          (char *)0x0,(char *)0x0,(bool *)0x0);
    std::__cxx11::string::~string((string *)&local_d8);
    GenLoadShader<tcu::Vector<float,4>>
              ((string *)&glsl_vs_1,this,*(int *)(this + 0x2c),internalformat,
               (Vector<float,_4> *)targets._24_8_);
    pcVar6 = (char *)std::__cxx11::string::c_str();
    local_54 = gl4cts::anon_unknown_0::ShaderImageLoadStoreBase::BuildProgram
                         ((ShaderImageLoadStoreBase *)this,"#version 420 core\nvoid main() {}",
                          pcVar6,"#version 420 core\nlayout(quads, point_mode) in;\nvoid main() {}",
                          (char *)0x0,(char *)0x0,(bool *)0x0);
    std::__cxx11::string::~string((string *)&glsl_vs_1);
  }
  else if (*(int *)(this + 0x2c) == 2) {
    local_100 = "#version 420 core\nvoid main() {}";
    GenStoreShader<tcu::Vector<float,4>>
              (&local_120,this,*(int *)(this + 0x2c),internalformat,write_value);
    pcVar6 = (char *)std::__cxx11::string::c_str();
    local_50 = gl4cts::anon_unknown_0::ShaderImageLoadStoreBase::BuildProgram
                         ((ShaderImageLoadStoreBase *)this,"#version 420 core\nvoid main() {}",
                          (char *)0x0,pcVar6,(char *)0x0,(char *)0x0,(bool *)0x0);
    std::__cxx11::string::~string((string *)&local_120);
    GenLoadShader<tcu::Vector<float,4>>
              ((string *)&glsl_vs_2,this,*(int *)(this + 0x2c),internalformat,
               (Vector<float,_4> *)targets._24_8_);
    pcVar6 = (char *)std::__cxx11::string::c_str();
    local_54 = gl4cts::anon_unknown_0::ShaderImageLoadStoreBase::BuildProgram
                         ((ShaderImageLoadStoreBase *)this,"#version 420 core\nvoid main() {}",
                          (char *)0x0,pcVar6,(char *)0x0,(char *)0x0,(bool *)0x0);
    std::__cxx11::string::~string((string *)&glsl_vs_2);
  }
  else if (*(int *)(this + 0x2c) == 3) {
    local_148 = "#version 420 core\nvoid main() {}";
    GenStoreShader<tcu::Vector<float,4>>
              (&local_168,this,*(int *)(this + 0x2c),internalformat,write_value);
    pcVar6 = (char *)std::__cxx11::string::c_str();
    local_50 = gl4cts::anon_unknown_0::ShaderImageLoadStoreBase::BuildProgram
                         ((ShaderImageLoadStoreBase *)this,"#version 420 core\nvoid main() {}",
                          (char *)0x0,(char *)0x0,pcVar6,(char *)0x0,(bool *)0x0);
    std::__cxx11::string::~string((string *)&local_168);
    GenLoadShader<tcu::Vector<float,4>>
              ((string *)((long)&source.field_2 + 8),this,*(int *)(this + 0x2c),internalformat,
               (Vector<float,_4> *)targets._24_8_);
    pcVar6 = (char *)std::__cxx11::string::c_str();
    local_54 = gl4cts::anon_unknown_0::ShaderImageLoadStoreBase::BuildProgram
                         ((ShaderImageLoadStoreBase *)this,"#version 420 core\nvoid main() {}",
                          (char *)0x0,(char *)0x0,pcVar6,(char *)0x0,(bool *)0x0);
    std::__cxx11::string::~string((string *)(source.field_2._M_local_buf + 8));
  }
  else if (*(int *)(this + 0x2c) == 4) {
    GenStoreShader<tcu::Vector<float,4>>
              ((string *)&src,this,*(int *)(this + 0x2c),internalformat,write_value);
    pGStack_1b0 = (GLchar *)std::__cxx11::string::c_str();
    source_1.field_2._12_4_ =
         glu::CallLogWrapper::glCreateShader((CallLogWrapper *)(this + 8),0x91b9);
    glu::CallLogWrapper::glShaderSource
              ((CallLogWrapper *)(this + 8),source_1.field_2._12_4_,1,&stack0xfffffffffffffe50,
               (GLint *)0x0);
    glu::CallLogWrapper::glCompileShader((CallLogWrapper *)(this + 8),source_1.field_2._12_4_);
    local_50 = glu::CallLogWrapper::glCreateProgram((CallLogWrapper *)(this + 8));
    glu::CallLogWrapper::glAttachShader
              ((CallLogWrapper *)(this + 8),local_50,source_1.field_2._12_4_);
    glu::CallLogWrapper::glLinkProgram((CallLogWrapper *)(this + 8),local_50);
    glu::CallLogWrapper::glDeleteShader((CallLogWrapper *)(this + 8),source_1.field_2._12_4_);
    std::__cxx11::string::~string((string *)&src);
    GenLoadShader<tcu::Vector<float,4>>
              ((string *)&src_1,this,*(int *)(this + 0x2c),internalformat,
               (Vector<float,_4> *)targets._24_8_);
    pGStack_1e0 = (GLchar *)std::__cxx11::string::c_str();
    textures[7] = glu::CallLogWrapper::glCreateShader((CallLogWrapper *)(this + 8),0x91b9);
    glu::CallLogWrapper::glShaderSource
              ((CallLogWrapper *)(this + 8),textures[7],1,&stack0xfffffffffffffe20,(GLint *)0x0);
    glu::CallLogWrapper::glCompileShader((CallLogWrapper *)(this + 8),textures[7]);
    local_54 = glu::CallLogWrapper::glCreateProgram((CallLogWrapper *)(this + 8));
    glu::CallLogWrapper::glAttachShader((CallLogWrapper *)(this + 8),local_54,textures[7]);
    glu::CallLogWrapper::glLinkProgram((CallLogWrapper *)(this + 8),local_54);
    glu::CallLogWrapper::glDeleteShader((CallLogWrapper *)(this + 8),textures[7]);
    std::__cxx11::string::~string((string *)&src_1);
  }
  glu::CallLogWrapper::glGenTextures((CallLogWrapper *)(this + 8),8,(GLuint *)&i);
  glu::CallLogWrapper::glGenTextures((CallLogWrapper *)(this + 8),1,&stack0xfffffffffffffdf4);
  glu::CallLogWrapper::glBindTexture((CallLogWrapper *)(this + 8),0xde1,GStack_20c);
  glu::CallLogWrapper::glTexParameteri((CallLogWrapper *)(this + 8),0xde1,0x2801,0x2600);
  glu::CallLogWrapper::glTexParameteri((CallLogWrapper *)(this + 8),0xde1,0x2800,0x2600);
  glu::CallLogWrapper::glTexStorage2D((CallLogWrapper *)(this + 8),0xde1,1,0x8814,1,1);
  for (i_1 = 0; i_1 < 8; i_1 = i_1 + 1) {
    glu::CallLogWrapper::glBindTexture((CallLogWrapper *)(this + 8),(&program_store)[i_1],(&i)[i_1])
    ;
    glu::CallLogWrapper::glTexParameteri
              ((CallLogWrapper *)(this + 8),(&program_store)[i_1],0x2801,0x2600);
    glu::CallLogWrapper::glTexParameteri
              ((CallLogWrapper *)(this + 8),(&program_store)[i_1],0x2800,0x2600);
    if ((&program_store)[i_1] == 0xde0) {
      glu::CallLogWrapper::glTexStorage1D
                ((CallLogWrapper *)(this + 8),(&program_store)[i_1],1,internalformat,1);
    }
    else if (((&program_store)[i_1] == 0xde1) || ((&program_store)[i_1] == 0x84f5)) {
      glu::CallLogWrapper::glTexStorage2D
                ((CallLogWrapper *)(this + 8),(&program_store)[i_1],1,internalformat,1,1);
    }
    else if (((&program_store)[i_1] == 0x806f) || ((&program_store)[i_1] == 0x8c1a)) {
      glu::CallLogWrapper::glTexStorage3D
                ((CallLogWrapper *)(this + 8),(&program_store)[i_1],1,internalformat,1,1,2);
    }
    else if ((&program_store)[i_1] == 0x8513) {
      glu::CallLogWrapper::glTexStorage2D
                ((CallLogWrapper *)(this + 8),(&program_store)[i_1],1,internalformat,1,1);
    }
    else if ((&program_store)[i_1] == 0x9009) {
      glu::CallLogWrapper::glTexStorage3D
                ((CallLogWrapper *)(this + 8),(&program_store)[i_1],1,internalformat,1,1,0xc);
    }
    else if ((&program_store)[i_1] == 0x8c18) {
      glu::CallLogWrapper::glTexStorage2D
                ((CallLogWrapper *)(this + 8),(&program_store)[i_1],1,internalformat,1,2);
    }
  }
  glu::CallLogWrapper::glBindImageTexture
            ((CallLogWrapper *)(this + 8),0,i,0,'\0',0,0x88b9,internalformat);
  glu::CallLogWrapper::glBindImageTexture
            ((CallLogWrapper *)(this + 8),1,texture_result,0,'\0',0,0x88b9,internalformat);
  glu::CallLogWrapper::glBindImageTexture
            ((CallLogWrapper *)(this + 8),2,textures[0],0,'\x01',0,0x88b9,internalformat);
  glu::CallLogWrapper::glBindImageTexture
            ((CallLogWrapper *)(this + 8),3,textures[1],0,'\0',0,0x88b9,internalformat);
  glu::CallLogWrapper::glBindImageTexture
            ((CallLogWrapper *)(this + 8),4,textures[2],0,'\x01',0,0x88b9,internalformat);
  glu::CallLogWrapper::glBindImageTexture
            ((CallLogWrapper *)(this + 8),5,textures[3],0,'\x01',0,0x88b9,internalformat);
  glu::CallLogWrapper::glBindImageTexture
            ((CallLogWrapper *)(this + 8),6,textures[4],0,'\x01',0,0x88b9,internalformat);
  glu::CallLogWrapper::glBindImageTexture
            ((CallLogWrapper *)(this + 8),7,textures[5],0,'\x01',0,0x88b9,internalformat);
  glu::CallLogWrapper::glUseProgram((CallLogWrapper *)(this + 8),local_50);
  GVar2 = glu::CallLogWrapper::glGetUniformLocation
                    ((CallLogWrapper *)(this + 8),local_50,"g_image_1d");
  glu::CallLogWrapper::glUniform1i((CallLogWrapper *)(this + 8),GVar2,0);
  GVar2 = glu::CallLogWrapper::glGetUniformLocation
                    ((CallLogWrapper *)(this + 8),local_50,"g_image_2d");
  glu::CallLogWrapper::glUniform1i((CallLogWrapper *)(this + 8),GVar2,1);
  GVar2 = glu::CallLogWrapper::glGetUniformLocation
                    ((CallLogWrapper *)(this + 8),local_50,"g_image_3d");
  glu::CallLogWrapper::glUniform1i((CallLogWrapper *)(this + 8),GVar2,2);
  GVar2 = glu::CallLogWrapper::glGetUniformLocation
                    ((CallLogWrapper *)(this + 8),local_50,"g_image_2drect");
  glu::CallLogWrapper::glUniform1i((CallLogWrapper *)(this + 8),GVar2,3);
  GVar2 = glu::CallLogWrapper::glGetUniformLocation
                    ((CallLogWrapper *)(this + 8),local_50,"g_image_cube");
  glu::CallLogWrapper::glUniform1i((CallLogWrapper *)(this + 8),GVar2,4);
  GVar2 = glu::CallLogWrapper::glGetUniformLocation
                    ((CallLogWrapper *)(this + 8),local_50,"g_image_1darray");
  glu::CallLogWrapper::glUniform1i((CallLogWrapper *)(this + 8),GVar2,5);
  GVar2 = glu::CallLogWrapper::glGetUniformLocation
                    ((CallLogWrapper *)(this + 8),local_50,"g_image_2darray");
  glu::CallLogWrapper::glUniform1i((CallLogWrapper *)(this + 8),GVar2,6);
  GVar2 = glu::CallLogWrapper::glGetUniformLocation
                    ((CallLogWrapper *)(this + 8),local_50,"g_image_cube_array");
  glu::CallLogWrapper::glUniform1i((CallLogWrapper *)(this + 8),GVar2,7);
  glu::CallLogWrapper::glBindVertexArray((CallLogWrapper *)(this + 8),*(GLuint *)(this + 0x28));
  if ((*(int *)(this + 0x2c) == 1) || (*(int *)(this + 0x2c) == 2)) {
    glu::CallLogWrapper::glPatchParameteri((CallLogWrapper *)(this + 8),0x8e72,1);
    glu::CallLogWrapper::glDrawArrays((CallLogWrapper *)(this + 8),0xe,0,1);
    glu::CallLogWrapper::glPatchParameteri((CallLogWrapper *)(this + 8),0x8e72,3);
  }
  else if (*(int *)(this + 0x2c) == 4) {
    glu::CallLogWrapper::glDispatchCompute((CallLogWrapper *)(this + 8),1,1,1);
  }
  else {
    glu::CallLogWrapper::glDrawArrays((CallLogWrapper *)(this + 8),0,0,1);
  }
  face._3_1_ = true;
  for (data.m_data[3] = 0.0; (int)data.m_data[3] < 8;
      data.m_data[3] = (float)((int)data.m_data[3] + 1)) {
    glu::CallLogWrapper::glBindTexture
              ((CallLogWrapper *)(this + 8),(&program_store)[(int)data.m_data[3]],
               (&i)[(int)data.m_data[3]]);
    glu::CallLogWrapper::glMemoryBarrier((CallLogWrapper *)(this + 8),0x100);
    if ((&program_store)[(int)data.m_data[3]] == 0x8513) {
      for (data.m_data[2] = 0.0; (int)data.m_data[2] < 6;
          data.m_data[2] = (float)((int)data.m_data[2] + 1)) {
        tcu::Vector<float,_4>::Vector((Vector<float,_4> *)local_22c);
        GVar3 = (int)data.m_data[2] + 0x8515;
        GVar4 = ShaderImageLoadStoreBase::Format<tcu::Vector<float,4>>
                          ((ShaderImageLoadStoreBase *)this);
        GVar5 = ShaderImageLoadStoreBase::Type<tcu::Vector<float,4>>
                          ((ShaderImageLoadStoreBase *)this);
        pfVar7 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)local_22c,0);
        glu::CallLogWrapper::glGetTexImage((CallLogWrapper *)(this + 8),GVar3,0,GVar4,GVar5,pfVar7);
        bVar1 = gl4cts::anon_unknown_0::ShaderImageLoadStoreBase::Equal
                          ((ShaderImageLoadStoreBase *)this,(vec4 *)local_22c,(vec4 *)targets._24_8_
                           ,internalformat);
        if (!bVar1) {
          face._3_1_ = false;
          tcu::Vector<float,_4>::Vector(&local_260,(Vector<float,_4> *)local_22c);
          ShaderImageLoadStoreBase::ToString<tcu::Vector<float,4>>
                    (&local_250,(ShaderImageLoadStoreBase *)this,&local_260);
          uVar8 = std::__cxx11::string::c_str();
          tcu::Vector<float,_4>::Vector(&local_290,(Vector<float,_4> *)targets._24_8_);
          ShaderImageLoadStoreBase::ToString<tcu::Vector<float,4>>
                    (&local_280,(ShaderImageLoadStoreBase *)this,&local_290);
          uVar9 = std::__cxx11::string::c_str();
          ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_
                    (&local_2b0,(ShaderImageLoadStoreBase *)this,internalformat);
          uVar10 = std::__cxx11::string::c_str();
          pcVar6 = gl4cts::anon_unknown_0::ShaderImageLoadStoreBase::EnumToString
                             ((ShaderImageLoadStoreBase *)this,(&program_store)[(int)data.m_data[3]]
                             );
          gl4cts::anon_unknown_0::ShaderImageLoadStoreBase::StageName
                    ((ShaderImageLoadStoreBase *)this,*(int *)(this + 0x2c));
          gl4cts::anon_unknown_0::Output
                    ("Value is: %s. Value should be: %s. Format is: %s. Target is: %s. Stage is: %s.\n"
                     ,uVar8,uVar9,uVar10,pcVar6);
          std::__cxx11::string::~string((string *)&local_2b0);
          std::__cxx11::string::~string((string *)&local_280);
          std::__cxx11::string::~string((string *)&local_250);
        }
      }
    }
    else {
      local_5d0 = (Vector<float,_4> *)&j;
      do {
        tcu::Vector<float,_4>::Vector(local_5d0);
        local_5d0 = local_5d0 + 1;
      } while (local_5d0 != (Vector<float,_4> *)(data_1[0xb].m_data + 2));
      memset(&j,0,0xc0);
      GVar3 = (&program_store)[(int)data.m_data[3]];
      GVar4 = ShaderImageLoadStoreBase::Format<tcu::Vector<float,4>>
                        ((ShaderImageLoadStoreBase *)this);
      GVar5 = ShaderImageLoadStoreBase::Type<tcu::Vector<float,4>>((ShaderImageLoadStoreBase *)this)
      ;
      glu::CallLogWrapper::glGetTexImage((CallLogWrapper *)(this + 8),GVar3,0,GVar4,GVar5,&j);
      local_37c = 1;
      if (((&program_store)[(int)data.m_data[3]] == 0x806f) ||
         ((&program_store)[(int)data.m_data[3]] == 0x8c1a)) {
        local_37c = 2;
      }
      else if ((&program_store)[(int)data.m_data[3]] == 0x9009) {
        local_37c = 0xc;
      }
      else if ((&program_store)[(int)data.m_data[3]] == 0x8c18) {
        local_37c = 2;
      }
      for (local_380 = 0; local_380 < local_37c; local_380 = local_380 + 1) {
        bVar1 = gl4cts::anon_unknown_0::ShaderImageLoadStoreBase::Equal
                          ((ShaderImageLoadStoreBase *)this,(vec4 *)(&j + (long)local_380 * 4),
                           (vec4 *)targets._24_8_,internalformat);
        if (!bVar1) {
          face._3_1_ = false;
          tcu::Vector<float,_4>::Vector(&local_3b0,(Vector<float,_4> *)(&j + (long)local_380 * 4));
          ShaderImageLoadStoreBase::ToString<tcu::Vector<float,4>>
                    (&local_3a0,(ShaderImageLoadStoreBase *)this,&local_3b0);
          uVar8 = std::__cxx11::string::c_str();
          tcu::Vector<float,_4>::Vector(&local_3e0,(Vector<float,_4> *)targets._24_8_);
          ShaderImageLoadStoreBase::ToString<tcu::Vector<float,4>>
                    (&local_3d0,(ShaderImageLoadStoreBase *)this,&local_3e0);
          uVar9 = std::__cxx11::string::c_str();
          ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_
                    ((string *)(color.m_data + 2),(ShaderImageLoadStoreBase *)this,internalformat);
          uVar10 = std::__cxx11::string::c_str();
          pcVar6 = gl4cts::anon_unknown_0::ShaderImageLoadStoreBase::EnumToString
                             ((ShaderImageLoadStoreBase *)this,(&program_store)[(int)data.m_data[3]]
                             );
          gl4cts::anon_unknown_0::ShaderImageLoadStoreBase::StageName
                    ((ShaderImageLoadStoreBase *)this,*(int *)(this + 0x2c));
          gl4cts::anon_unknown_0::Output
                    ("Value is: %s. Value should be: %s. Format is: %s. Target is: %s. Stage is: %s.\n"
                     ,uVar8,uVar9,uVar10,pcVar6);
          std::__cxx11::string::~string((string *)(color.m_data + 2));
          std::__cxx11::string::~string((string *)&local_3d0);
          std::__cxx11::string::~string((string *)&local_3a0);
        }
      }
    }
  }
  glu::CallLogWrapper::glBindImageTexture
            ((CallLogWrapper *)(this + 8),0,GStack_20c,0,'\0',0,0x88b9,0x8814);
  glu::CallLogWrapper::glBindImageTexture
            ((CallLogWrapper *)(this + 8),1,texture_result,0,'\0',0,35000,internalformat);
  glu::CallLogWrapper::glBindImageTexture
            ((CallLogWrapper *)(this + 8),2,textures[0],0,'\x01',0,35000,internalformat);
  glu::CallLogWrapper::glBindImageTexture
            ((CallLogWrapper *)(this + 8),3,textures[1],0,'\0',0,35000,internalformat);
  glu::CallLogWrapper::glBindImageTexture
            ((CallLogWrapper *)(this + 8),4,textures[2],0,'\x01',0,35000,internalformat);
  glu::CallLogWrapper::glBindImageTexture
            ((CallLogWrapper *)(this + 8),5,textures[3],0,'\x01',0,35000,internalformat);
  glu::CallLogWrapper::glBindImageTexture
            ((CallLogWrapper *)(this + 8),6,textures[4],0,'\x01',0,35000,internalformat);
  glu::CallLogWrapper::glBindImageTexture
            ((CallLogWrapper *)(this + 8),7,textures[5],0,'\x01',0,35000,internalformat);
  glu::CallLogWrapper::glUseProgram((CallLogWrapper *)(this + 8),local_54);
  GVar2 = glu::CallLogWrapper::glGetUniformLocation
                    ((CallLogWrapper *)(this + 8),local_54,"g_image_result");
  glu::CallLogWrapper::glUniform1i((CallLogWrapper *)(this + 8),GVar2,0);
  GVar2 = glu::CallLogWrapper::glGetUniformLocation
                    ((CallLogWrapper *)(this + 8),local_54,"g_image_2d");
  glu::CallLogWrapper::glUniform1i((CallLogWrapper *)(this + 8),GVar2,1);
  GVar2 = glu::CallLogWrapper::glGetUniformLocation
                    ((CallLogWrapper *)(this + 8),local_54,"g_image_3d");
  glu::CallLogWrapper::glUniform1i((CallLogWrapper *)(this + 8),GVar2,2);
  GVar2 = glu::CallLogWrapper::glGetUniformLocation
                    ((CallLogWrapper *)(this + 8),local_54,"g_image_2drect");
  glu::CallLogWrapper::glUniform1i((CallLogWrapper *)(this + 8),GVar2,3);
  GVar2 = glu::CallLogWrapper::glGetUniformLocation
                    ((CallLogWrapper *)(this + 8),local_54,"g_image_cube");
  glu::CallLogWrapper::glUniform1i((CallLogWrapper *)(this + 8),GVar2,4);
  GVar2 = glu::CallLogWrapper::glGetUniformLocation
                    ((CallLogWrapper *)(this + 8),local_54,"g_image_1darray");
  glu::CallLogWrapper::glUniform1i((CallLogWrapper *)(this + 8),GVar2,5);
  GVar2 = glu::CallLogWrapper::glGetUniformLocation
                    ((CallLogWrapper *)(this + 8),local_54,"g_image_2darray");
  glu::CallLogWrapper::glUniform1i((CallLogWrapper *)(this + 8),GVar2,6);
  GVar2 = glu::CallLogWrapper::glGetUniformLocation
                    ((CallLogWrapper *)(this + 8),local_54,"g_image_cube_array");
  glu::CallLogWrapper::glUniform1i((CallLogWrapper *)(this + 8),GVar2,7);
  if ((*(int *)(this + 0x2c) == 1) || (*(int *)(this + 0x2c) == 2)) {
    glu::CallLogWrapper::glPatchParameteri((CallLogWrapper *)(this + 8),0x8e72,1);
    glu::CallLogWrapper::glDrawArrays((CallLogWrapper *)(this + 8),0xe,0,1);
    glu::CallLogWrapper::glPatchParameteri((CallLogWrapper *)(this + 8),0x8e72,3);
  }
  else if (*(int *)(this + 0x2c) == 4) {
    glu::CallLogWrapper::glDispatchCompute((CallLogWrapper *)(this + 8),1,1,1);
  }
  else {
    glu::CallLogWrapper::glDrawArrays((CallLogWrapper *)(this + 8),0,0,1);
  }
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)local_410);
  glu::CallLogWrapper::glBindTexture((CallLogWrapper *)(this + 8),0xde1,GStack_20c);
  glu::CallLogWrapper::glMemoryBarrier((CallLogWrapper *)(this + 8),0x100);
  pfVar7 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)local_410,0);
  glu::CallLogWrapper::glGetTexImage((CallLogWrapper *)(this + 8),0xde1,0,0x1908,0x1406,pfVar7);
  tcu::Vector<float,_4>::Vector(&local_420,0.0,1.0,0.0,1.0);
  bVar1 = tcu::allEqual<float,4>((Vector<float,_4> *)local_410,&local_420);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    face._3_1_ = false;
    tcu::Vector<float,_4>::Vector(&local_450,(Vector<float,_4> *)local_410);
    ShaderImageLoadStoreBase::ToString<tcu::Vector<float,4>>
              (&local_440,(ShaderImageLoadStoreBase *)this,&local_450);
    uVar8 = std::__cxx11::string::c_str();
    ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_
              (&local_470,(ShaderImageLoadStoreBase *)this,internalformat);
    uVar9 = std::__cxx11::string::c_str();
    pcVar6 = gl4cts::anon_unknown_0::ShaderImageLoadStoreBase::StageName
                       ((ShaderImageLoadStoreBase *)this,*(int *)(this + 0x2c));
    gl4cts::anon_unknown_0::Output
              ("Color is: %s. Format is: %s. Stage is: %s.\n",uVar8,uVar9,pcVar6);
    std::__cxx11::string::~string((string *)&local_470);
    std::__cxx11::string::~string((string *)&local_440);
  }
  glu::CallLogWrapper::glUseProgram((CallLogWrapper *)(this + 8),0);
  glu::CallLogWrapper::glDeleteProgram((CallLogWrapper *)(this + 8),local_50);
  glu::CallLogWrapper::glDeleteProgram((CallLogWrapper *)(this + 8),local_54);
  glu::CallLogWrapper::glDeleteTextures((CallLogWrapper *)(this + 8),8,(GLuint *)&i);
  glu::CallLogWrapper::glDeleteTextures((CallLogWrapper *)(this + 8),1,&stack0xfffffffffffffdf4);
  return face._3_1_;
}

Assistant:

bool Write(GLenum internalformat, const T& write_value, const T& expected_value)
	{
		const GLenum targets[] = { GL_TEXTURE_1D,		GL_TEXTURE_2D,
								   GL_TEXTURE_3D,		GL_TEXTURE_RECTANGLE,
								   GL_TEXTURE_CUBE_MAP, GL_TEXTURE_1D_ARRAY,
								   GL_TEXTURE_2D_ARRAY, GL_TEXTURE_CUBE_MAP_ARRAY };
		const int kTargets		= sizeof(targets) / sizeof(targets[0]);
		GLuint	program_store = 0;
		GLuint	program_load  = 0;
		if (m_stage == 0)
		{ // VS
			program_store =
				BuildProgram(GenStoreShader(m_stage, internalformat, write_value).c_str(), NULL, NULL, NULL, NULL);
			program_load =
				BuildProgram(GenLoadShader(m_stage, internalformat, expected_value).c_str(), NULL, NULL, NULL, NULL);
		}
		else if (m_stage == 1)
		{ // TCS
			const char* const glsl_vs  = "#version 420 core" NL "void main() {}";
			const char* const glsl_tes = "#version 420 core" NL "layout(quads, point_mode) in;" NL "void main() {}";
			program_store = BuildProgram(glsl_vs, GenStoreShader(m_stage, internalformat, write_value).c_str(),
										 glsl_tes, NULL, NULL);
			program_load = BuildProgram(glsl_vs, GenLoadShader(m_stage, internalformat, expected_value).c_str(),
										glsl_tes, NULL, NULL);
		}
		else if (m_stage == 2)
		{ // TES
			const char* const glsl_vs = "#version 420 core" NL "void main() {}";
			program_store =
				BuildProgram(glsl_vs, NULL, GenStoreShader(m_stage, internalformat, write_value).c_str(), NULL, NULL);
			program_load =
				BuildProgram(glsl_vs, NULL, GenLoadShader(m_stage, internalformat, expected_value).c_str(), NULL, NULL);
		}
		else if (m_stage == 3)
		{ // GS
			const char* const glsl_vs = "#version 420 core" NL "void main() {}";
			program_store =
				BuildProgram(glsl_vs, NULL, NULL, GenStoreShader(m_stage, internalformat, write_value).c_str(), NULL);
			program_load =
				BuildProgram(glsl_vs, NULL, NULL, GenLoadShader(m_stage, internalformat, expected_value).c_str(), NULL);
		}
		else if (m_stage == 4)
		{ // CS
			{
				std::string		  source = GenStoreShader(m_stage, internalformat, write_value);
				const char* const src	= source.c_str();
				GLuint			  sh	 = glCreateShader(GL_COMPUTE_SHADER);
				glShaderSource(sh, 1, &src, NULL);
				glCompileShader(sh);
				program_store = glCreateProgram();
				glAttachShader(program_store, sh);
				glLinkProgram(program_store);
				glDeleteShader(sh);
			}
			{
				std::string		  source = GenLoadShader(m_stage, internalformat, expected_value);
				const char* const src	= source.c_str();
				GLuint			  sh	 = glCreateShader(GL_COMPUTE_SHADER);
				glShaderSource(sh, 1, &src, NULL);
				glCompileShader(sh);
				program_load = glCreateProgram();
				glAttachShader(program_load, sh);
				glLinkProgram(program_load);
				glDeleteShader(sh);
			}
		}
		GLuint textures[kTargets], texture_result;
		glGenTextures(kTargets, textures);
		glGenTextures(1, &texture_result);

		glBindTexture(GL_TEXTURE_2D, texture_result);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		glTexStorage2D(GL_TEXTURE_2D, 1, GL_RGBA32F, 1, 1);

		for (int i = 0; i < kTargets; ++i)
		{
			glBindTexture(targets[i], textures[i]);
			glTexParameteri(targets[i], GL_TEXTURE_MIN_FILTER, GL_NEAREST);
			glTexParameteri(targets[i], GL_TEXTURE_MAG_FILTER, GL_NEAREST);

			if (targets[i] == GL_TEXTURE_1D)
			{
				glTexStorage1D(targets[i], 1, internalformat, 1);
			}
			else if (targets[i] == GL_TEXTURE_2D || targets[i] == GL_TEXTURE_RECTANGLE)
			{
				glTexStorage2D(targets[i], 1, internalformat, 1, 1);
			}
			else if (targets[i] == GL_TEXTURE_3D || targets[i] == GL_TEXTURE_2D_ARRAY)
			{
				glTexStorage3D(targets[i], 1, internalformat, 1, 1, 2);
			}
			else if (targets[i] == GL_TEXTURE_CUBE_MAP)
			{
				glTexStorage2D(targets[i], 1, internalformat, 1, 1);
			}
			else if (targets[i] == GL_TEXTURE_CUBE_MAP_ARRAY)
			{
				glTexStorage3D(targets[i], 1, internalformat, 1, 1, 12);
			}
			else if (targets[i] == GL_TEXTURE_1D_ARRAY)
			{
				glTexStorage2D(targets[i], 1, internalformat, 1, 2);
			}
		}
		glBindImageTexture(0, textures[0], 0, GL_FALSE, 0, GL_WRITE_ONLY, internalformat);
		glBindImageTexture(1, textures[1], 0, GL_FALSE, 0, GL_WRITE_ONLY, internalformat);
		glBindImageTexture(2, textures[2], 0, GL_TRUE, 0, GL_WRITE_ONLY, internalformat);
		glBindImageTexture(3, textures[3], 0, GL_FALSE, 0, GL_WRITE_ONLY, internalformat);
		glBindImageTexture(4, textures[4], 0, GL_TRUE, 0, GL_WRITE_ONLY, internalformat);
		glBindImageTexture(5, textures[5], 0, GL_TRUE, 0, GL_WRITE_ONLY, internalformat);
		glBindImageTexture(6, textures[6], 0, GL_TRUE, 0, GL_WRITE_ONLY, internalformat);
		glBindImageTexture(7, textures[7], 0, GL_TRUE, 0, GL_WRITE_ONLY, internalformat);

		glUseProgram(program_store);
		glUniform1i(glGetUniformLocation(program_store, "g_image_1d"), 0);
		glUniform1i(glGetUniformLocation(program_store, "g_image_2d"), 1);
		glUniform1i(glGetUniformLocation(program_store, "g_image_3d"), 2);
		glUniform1i(glGetUniformLocation(program_store, "g_image_2drect"), 3);
		glUniform1i(glGetUniformLocation(program_store, "g_image_cube"), 4);
		glUniform1i(glGetUniformLocation(program_store, "g_image_1darray"), 5);
		glUniform1i(glGetUniformLocation(program_store, "g_image_2darray"), 6);
		glUniform1i(glGetUniformLocation(program_store, "g_image_cube_array"), 7);

		glBindVertexArray(m_vao);
		if (m_stage == 1 || m_stage == 2)
		{ // TCS or TES
			glPatchParameteri(GL_PATCH_VERTICES, 1);
			glDrawArrays(GL_PATCHES, 0, 1);
			glPatchParameteri(GL_PATCH_VERTICES, 3);
		}
		else if (m_stage == 4)
		{ // CS
			glDispatchCompute(1, 1, 1);
		}
		else
		{
			glDrawArrays(GL_POINTS, 0, 1);
		}

		bool status = true;
		for (int i = 0; i < kTargets; ++i)
		{
			glBindTexture(targets[i], textures[i]);
			glMemoryBarrier(GL_TEXTURE_UPDATE_BARRIER_BIT);

			if (targets[i] == GL_TEXTURE_CUBE_MAP)
			{
				for (int face = 0; face < 6; ++face)
				{
					T data;
					glGetTexImage(GL_TEXTURE_CUBE_MAP_POSITIVE_X + face, 0, Format<T>(), Type<T>(), &data[0]);
					if (!Equal(data, expected_value, internalformat))
					{
						status = false;
						Output("Value is: %s. Value should be: %s. Format is: %s. Target is: %s. Stage is: %s.\n",
							   ToString(data).c_str(), ToString(expected_value).c_str(),
							   FormatEnumToString(internalformat).c_str(), EnumToString(targets[i]),
							   StageName(m_stage));
					}
				}
			}
			else
			{
				T data[12];
				memset(&data[0], 0, sizeof(data));
				glGetTexImage(targets[i], 0, Format<T>(), Type<T>(), &data[0]);

				int count = 1;
				if (targets[i] == GL_TEXTURE_3D || targets[i] == GL_TEXTURE_2D_ARRAY)
					count = 2;
				else if (targets[i] == GL_TEXTURE_CUBE_MAP_ARRAY)
					count = 12;
				else if (targets[i] == GL_TEXTURE_1D_ARRAY)
					count = 2;

				for (int j = 0; j < count; ++j)
				{
					if (!Equal(data[j], expected_value, internalformat))
					{
						status = false;
						Output("Value is: %s. Value should be: %s. Format is: %s. Target is: %s. Stage is: %s.\n",
							   ToString(data[j]).c_str(), ToString(expected_value).c_str(),
							   FormatEnumToString(internalformat).c_str(), EnumToString(targets[i]),
							   StageName(m_stage));
					}
				}
			}
		}
		glBindImageTexture(0, texture_result, 0, GL_FALSE, 0, GL_WRITE_ONLY, GL_RGBA32F);
		glBindImageTexture(1, textures[1], 0, GL_FALSE, 0, GL_READ_ONLY, internalformat);
		glBindImageTexture(2, textures[2], 0, GL_TRUE, 0, GL_READ_ONLY, internalformat);
		glBindImageTexture(3, textures[3], 0, GL_FALSE, 0, GL_READ_ONLY, internalformat);
		glBindImageTexture(4, textures[4], 0, GL_TRUE, 0, GL_READ_ONLY, internalformat);
		glBindImageTexture(5, textures[5], 0, GL_TRUE, 0, GL_READ_ONLY, internalformat);
		glBindImageTexture(6, textures[6], 0, GL_TRUE, 0, GL_READ_ONLY, internalformat);
		glBindImageTexture(7, textures[7], 0, GL_TRUE, 0, GL_READ_ONLY, internalformat);

		glUseProgram(program_load);
		glUniform1i(glGetUniformLocation(program_load, "g_image_result"), 0);
		glUniform1i(glGetUniformLocation(program_load, "g_image_2d"), 1);
		glUniform1i(glGetUniformLocation(program_load, "g_image_3d"), 2);
		glUniform1i(glGetUniformLocation(program_load, "g_image_2drect"), 3);
		glUniform1i(glGetUniformLocation(program_load, "g_image_cube"), 4);
		glUniform1i(glGetUniformLocation(program_load, "g_image_1darray"), 5);
		glUniform1i(glGetUniformLocation(program_load, "g_image_2darray"), 6);
		glUniform1i(glGetUniformLocation(program_load, "g_image_cube_array"), 7);

		if (m_stage == 1 || m_stage == 2)
		{ // TCS or TES
			glPatchParameteri(GL_PATCH_VERTICES, 1);
			glDrawArrays(GL_PATCHES, 0, 1);
			glPatchParameteri(GL_PATCH_VERTICES, 3);
		}
		else if (m_stage == 4)
		{ // CS
			glDispatchCompute(1, 1, 1);
		}
		else
		{
			glDrawArrays(GL_POINTS, 0, 1);
		}
		{
			vec4 color;
			glBindTexture(GL_TEXTURE_2D, texture_result);
			glMemoryBarrier(GL_TEXTURE_UPDATE_BARRIER_BIT);
			glGetTexImage(GL_TEXTURE_2D, 0, GL_RGBA, GL_FLOAT, &color[0]);
			if (!tcu::allEqual(color, vec4(0, 1, 0, 1)))
			{
				status = false;
				Output("Color is: %s. Format is: %s. Stage is: %s.\n", ToString(color).c_str(),
					   FormatEnumToString(internalformat).c_str(), StageName(m_stage));
			}
		}
		glUseProgram(0);
		glDeleteProgram(program_store);
		glDeleteProgram(program_load);
		glDeleteTextures(kTargets, textures);
		glDeleteTextures(1, &texture_result);
		return status;
	}